

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O0

REF_STATUS ref_fixture_pri_tet_cap_grid(REF_GRID *ref_grid_ptr,REF_MPI ref_mpi)

{
  REF_GRID pRVar1;
  REF_NODE ref_node_00;
  uint uVar2;
  int local_8f4;
  int local_8c8;
  int local_89c;
  int local_870;
  int local_844;
  int local_818;
  int local_7ec;
  int local_7c0;
  int local_794;
  int local_768;
  long local_730;
  REF_INT local_720;
  long local_718;
  long local_6f8;
  long local_6c8;
  REF_INT local_6b8;
  long local_6b0;
  long local_690;
  long local_660;
  REF_INT local_650;
  long local_648;
  long local_628;
  long local_5f8;
  REF_INT local_5e8;
  long local_5e0;
  long local_5c0;
  int local_59c;
  int local_570;
  int local_544;
  int local_518;
  long local_4e0;
  REF_INT local_4d0;
  long local_4c8;
  long local_4a8;
  long local_478;
  REF_INT local_468;
  long local_460;
  long local_440;
  long local_410;
  REF_INT local_400;
  long local_3f8;
  long local_3d8;
  long local_3a8;
  REF_INT local_398;
  long local_390;
  long local_370;
  long local_340;
  REF_INT local_330;
  long local_328;
  long local_308;
  long local_2d8;
  REF_INT local_2c8;
  long local_2c0;
  long local_2a0;
  int local_27c;
  int local_250;
  int local_224;
  int local_1f8;
  int local_1cc;
  int local_1a0;
  REF_STATUS ref_private_macro_code_rss_26;
  REF_STATUS ref_private_macro_code_rss_25;
  REF_STATUS ref_private_macro_code_rss_24;
  REF_STATUS ref_private_macro_code_rss_23;
  REF_STATUS ref_private_macro_code_rss_22;
  REF_STATUS ref_private_macro_code_rss_21;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT nnodesg;
  REF_INT cell;
  REF_INT local [27];
  REF_INT global [27];
  REF_NODE ref_node;
  REF_GRID ref_grid;
  REF_MPI ref_mpi_local;
  REF_GRID *ref_grid_ptr_local;
  
  uVar2 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x28a
           ,"ref_fixture_pri_tet_cap_grid",(ulong)uVar2,"create");
    return uVar2;
  }
  pRVar1 = *ref_grid_ptr;
  ref_node_00 = pRVar1->node;
  local[0x1a] = 0;
  if (0 / ((ref_mpi->n + 6) / ref_mpi->n) < 7 - ref_mpi->n * (6 / ref_mpi->n)) {
    local_1a0 = 0 / ((ref_mpi->n + 6) / ref_mpi->n);
  }
  else {
    local_1a0 = -((7 - ref_mpi->n * (6 / ref_mpi->n)) * ((ref_mpi->n + 6) / ref_mpi->n)) /
                (6 / ref_mpi->n) + (7 - ref_mpi->n * (6 / ref_mpi->n));
  }
  if (ref_mpi->id == local_1a0) {
LAB_00127bb4:
    uVar2 = ref_node_add(ref_node_00,0,&nnodesg);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x2a0,"ref_fixture_pri_tet_cap_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[nnodesg * 0xf] = 0.0;
    ref_node_00->real[nnodesg * 0xf + 1] = 0.0;
    ref_node_00->real[nnodesg * 0xf + 2] = 0.0;
    if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
      local_2a0 = -1;
    }
    else {
      local_2a0 = ref_node_00->global[nnodesg];
    }
    if (local_2a0 / (long)((ref_mpi->n + 6) / ref_mpi->n) <
        (long)(7 - ref_mpi->n * (6 / ref_mpi->n))) {
      if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
        local_2c0 = -1;
      }
      else {
        local_2c0 = ref_node_00->global[nnodesg];
      }
      local_2c8 = (REF_INT)(local_2c0 / (long)((ref_mpi->n + 6) / ref_mpi->n));
    }
    else {
      if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
        local_2d8 = -1;
      }
      else {
        local_2d8 = ref_node_00->global[nnodesg];
      }
      local_2c8 = (int)((local_2d8 -
                        (7 - ref_mpi->n * (6 / ref_mpi->n)) * ((ref_mpi->n + 6) / ref_mpi->n)) /
                       (long)(6 / ref_mpi->n)) + (7 - ref_mpi->n * (6 / ref_mpi->n));
    }
    ref_node_00->part[nnodesg] = local_2c8;
    uVar2 = ref_node_add(ref_node_00,1,&cell);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x2a1,"ref_fixture_pri_tet_cap_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[cell * 0xf] = 1.0;
    ref_node_00->real[cell * 0xf + 1] = 0.0;
    ref_node_00->real[cell * 0xf + 2] = 0.0;
    if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
      local_308 = -1;
    }
    else {
      local_308 = ref_node_00->global[cell];
    }
    if (local_308 / (long)((ref_mpi->n + 6) / ref_mpi->n) <
        (long)(7 - ref_mpi->n * (6 / ref_mpi->n))) {
      if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
        local_328 = -1;
      }
      else {
        local_328 = ref_node_00->global[cell];
      }
      local_330 = (REF_INT)(local_328 / (long)((ref_mpi->n + 6) / ref_mpi->n));
    }
    else {
      if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
        local_340 = -1;
      }
      else {
        local_340 = ref_node_00->global[cell];
      }
      local_330 = (int)((local_340 -
                        (7 - ref_mpi->n * (6 / ref_mpi->n)) * ((ref_mpi->n + 6) / ref_mpi->n)) /
                       (long)(6 / ref_mpi->n)) + (7 - ref_mpi->n * (6 / ref_mpi->n));
    }
    ref_node_00->part[cell] = local_330;
    uVar2 = ref_node_add(ref_node_00,2,local);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x2a2,"ref_fixture_pri_tet_cap_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[local[0] * 0xf] = 0.0;
    ref_node_00->real[local[0] * 0xf + 1] = 1.0;
    ref_node_00->real[local[0] * 0xf + 2] = 0.0;
    if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0)) {
      local_370 = -1;
    }
    else {
      local_370 = ref_node_00->global[local[0]];
    }
    if (local_370 / (long)((ref_mpi->n + 6) / ref_mpi->n) <
        (long)(7 - ref_mpi->n * (6 / ref_mpi->n))) {
      if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0))
      {
        local_390 = -1;
      }
      else {
        local_390 = ref_node_00->global[local[0]];
      }
      local_398 = (REF_INT)(local_390 / (long)((ref_mpi->n + 6) / ref_mpi->n));
    }
    else {
      if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0))
      {
        local_3a8 = -1;
      }
      else {
        local_3a8 = ref_node_00->global[local[0]];
      }
      local_398 = (int)((local_3a8 -
                        (7 - ref_mpi->n * (6 / ref_mpi->n)) * ((ref_mpi->n + 6) / ref_mpi->n)) /
                       (long)(6 / ref_mpi->n)) + (7 - ref_mpi->n * (6 / ref_mpi->n));
    }
    ref_node_00->part[local[0]] = local_398;
    uVar2 = ref_node_add(ref_node_00,3,local + 1);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x2a3,"ref_fixture_pri_tet_cap_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[local[1] * 0xf] = 0.0;
    ref_node_00->real[local[1] * 0xf + 1] = 0.0;
    ref_node_00->real[local[1] * 0xf + 2] = 1.0;
    if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0)) {
      local_3d8 = -1;
    }
    else {
      local_3d8 = ref_node_00->global[local[1]];
    }
    if (local_3d8 / (long)((ref_mpi->n + 6) / ref_mpi->n) <
        (long)(7 - ref_mpi->n * (6 / ref_mpi->n))) {
      if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0))
      {
        local_3f8 = -1;
      }
      else {
        local_3f8 = ref_node_00->global[local[1]];
      }
      local_400 = (REF_INT)(local_3f8 / (long)((ref_mpi->n + 6) / ref_mpi->n));
    }
    else {
      if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0))
      {
        local_410 = -1;
      }
      else {
        local_410 = ref_node_00->global[local[1]];
      }
      local_400 = (int)((local_410 -
                        (7 - ref_mpi->n * (6 / ref_mpi->n)) * ((ref_mpi->n + 6) / ref_mpi->n)) /
                       (long)(6 / ref_mpi->n)) + (7 - ref_mpi->n * (6 / ref_mpi->n));
    }
    ref_node_00->part[local[1]] = local_400;
    uVar2 = ref_node_add(ref_node_00,4,local + 2);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x2a4,"ref_fixture_pri_tet_cap_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[local[2] * 0xf] = 1.0;
    ref_node_00->real[local[2] * 0xf + 1] = 0.0;
    ref_node_00->real[local[2] * 0xf + 2] = 1.0;
    if (((local[2] < 0) || (ref_node_00->max <= local[2])) || (ref_node_00->global[local[2]] < 0)) {
      local_440 = -1;
    }
    else {
      local_440 = ref_node_00->global[local[2]];
    }
    if (local_440 / (long)((ref_mpi->n + 6) / ref_mpi->n) <
        (long)(7 - ref_mpi->n * (6 / ref_mpi->n))) {
      if (((local[2] < 0) || (ref_node_00->max <= local[2])) || (ref_node_00->global[local[2]] < 0))
      {
        local_460 = -1;
      }
      else {
        local_460 = ref_node_00->global[local[2]];
      }
      local_468 = (REF_INT)(local_460 / (long)((ref_mpi->n + 6) / ref_mpi->n));
    }
    else {
      if (((local[2] < 0) || (ref_node_00->max <= local[2])) || (ref_node_00->global[local[2]] < 0))
      {
        local_478 = -1;
      }
      else {
        local_478 = ref_node_00->global[local[2]];
      }
      local_468 = (int)((local_478 -
                        (7 - ref_mpi->n * (6 / ref_mpi->n)) * ((ref_mpi->n + 6) / ref_mpi->n)) /
                       (long)(6 / ref_mpi->n)) + (7 - ref_mpi->n * (6 / ref_mpi->n));
    }
    ref_node_00->part[local[2]] = local_468;
    uVar2 = ref_node_add(ref_node_00,5,local + 3);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x2a5,"ref_fixture_pri_tet_cap_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[local[3] * 0xf] = 0.0;
    ref_node_00->real[local[3] * 0xf + 1] = 1.0;
    ref_node_00->real[local[3] * 0xf + 2] = 1.0;
    if (((local[3] < 0) || (ref_node_00->max <= local[3])) || (ref_node_00->global[local[3]] < 0)) {
      local_4a8 = -1;
    }
    else {
      local_4a8 = ref_node_00->global[local[3]];
    }
    if (local_4a8 / (long)((ref_mpi->n + 6) / ref_mpi->n) <
        (long)(7 - ref_mpi->n * (6 / ref_mpi->n))) {
      if (((local[3] < 0) || (ref_node_00->max <= local[3])) || (ref_node_00->global[local[3]] < 0))
      {
        local_4c8 = -1;
      }
      else {
        local_4c8 = ref_node_00->global[local[3]];
      }
      local_4d0 = (REF_INT)(local_4c8 / (long)((ref_mpi->n + 6) / ref_mpi->n));
    }
    else {
      if (((local[3] < 0) || (ref_node_00->max <= local[3])) || (ref_node_00->global[local[3]] < 0))
      {
        local_4e0 = -1;
      }
      else {
        local_4e0 = ref_node_00->global[local[3]];
      }
      local_4d0 = (int)((local_4e0 -
                        (7 - ref_mpi->n * (6 / ref_mpi->n)) * ((ref_mpi->n + 6) / ref_mpi->n)) /
                       (long)(6 / ref_mpi->n)) + (7 - ref_mpi->n * (6 / ref_mpi->n));
    }
    ref_node_00->part[local[3]] = local_4d0;
    uVar2 = ref_cell_add(pRVar1->cell[10],&nnodesg,&ref_private_macro_code_rss);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x2a7,"ref_fixture_pri_tet_cap_grid",(ulong)uVar2,"add prism");
      return uVar2;
    }
  }
  else {
    if (1 / ((ref_mpi->n + 6) / ref_mpi->n) < 7 - ref_mpi->n * (6 / ref_mpi->n)) {
      local_1cc = 1 / ((ref_mpi->n + 6) / ref_mpi->n);
    }
    else {
      local_1cc = (1 - (7 - ref_mpi->n * (6 / ref_mpi->n)) * ((ref_mpi->n + 6) / ref_mpi->n)) /
                  (6 / ref_mpi->n) + (7 - ref_mpi->n * (6 / ref_mpi->n));
    }
    if (ref_mpi->id == local_1cc) goto LAB_00127bb4;
    if (2 / ((ref_mpi->n + 6) / ref_mpi->n) < 7 - ref_mpi->n * (6 / ref_mpi->n)) {
      local_1f8 = 2 / ((ref_mpi->n + 6) / ref_mpi->n);
    }
    else {
      local_1f8 = (2 - (7 - ref_mpi->n * (6 / ref_mpi->n)) * ((ref_mpi->n + 6) / ref_mpi->n)) /
                  (6 / ref_mpi->n) + (7 - ref_mpi->n * (6 / ref_mpi->n));
    }
    if (ref_mpi->id == local_1f8) goto LAB_00127bb4;
    if (3 / ((ref_mpi->n + 6) / ref_mpi->n) < 7 - ref_mpi->n * (6 / ref_mpi->n)) {
      local_224 = 3 / ((ref_mpi->n + 6) / ref_mpi->n);
    }
    else {
      local_224 = (3 - (7 - ref_mpi->n * (6 / ref_mpi->n)) * ((ref_mpi->n + 6) / ref_mpi->n)) /
                  (6 / ref_mpi->n) + (7 - ref_mpi->n * (6 / ref_mpi->n));
    }
    if (ref_mpi->id == local_224) goto LAB_00127bb4;
    if (4 / ((ref_mpi->n + 6) / ref_mpi->n) < 7 - ref_mpi->n * (6 / ref_mpi->n)) {
      local_250 = 4 / ((ref_mpi->n + 6) / ref_mpi->n);
    }
    else {
      local_250 = (4 - (7 - ref_mpi->n * (6 / ref_mpi->n)) * ((ref_mpi->n + 6) / ref_mpi->n)) /
                  (6 / ref_mpi->n) + (7 - ref_mpi->n * (6 / ref_mpi->n));
    }
    if (ref_mpi->id == local_250) goto LAB_00127bb4;
    if (5 / ((ref_mpi->n + 6) / ref_mpi->n) < 7 - ref_mpi->n * (6 / ref_mpi->n)) {
      local_27c = 5 / ((ref_mpi->n + 6) / ref_mpi->n);
    }
    else {
      local_27c = (5 - (7 - ref_mpi->n * (6 / ref_mpi->n)) * ((ref_mpi->n + 6) / ref_mpi->n)) /
                  (6 / ref_mpi->n) + (7 - ref_mpi->n * (6 / ref_mpi->n));
    }
    if (ref_mpi->id == local_27c) goto LAB_00127bb4;
  }
  local[0x1a] = 3;
  if (3 / ((ref_mpi->n + 6) / ref_mpi->n) < 7 - ref_mpi->n * (6 / ref_mpi->n)) {
    local_518 = 3 / ((ref_mpi->n + 6) / ref_mpi->n);
  }
  else {
    local_518 = (3 - (7 - ref_mpi->n * (6 / ref_mpi->n)) * ((ref_mpi->n + 6) / ref_mpi->n)) /
                (6 / ref_mpi->n) + (7 - ref_mpi->n * (6 / ref_mpi->n));
  }
  if (ref_mpi->id == local_518) {
LAB_00129775:
    uVar2 = ref_node_add(ref_node_00,3,&nnodesg);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x2b6,"ref_fixture_pri_tet_cap_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[nnodesg * 0xf] = 0.0;
    ref_node_00->real[nnodesg * 0xf + 1] = 0.0;
    ref_node_00->real[nnodesg * 0xf + 2] = 1.0;
    if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
      local_5c0 = -1;
    }
    else {
      local_5c0 = ref_node_00->global[nnodesg];
    }
    if (local_5c0 / (long)((ref_mpi->n + 6) / ref_mpi->n) <
        (long)(7 - ref_mpi->n * (6 / ref_mpi->n))) {
      if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
        local_5e0 = -1;
      }
      else {
        local_5e0 = ref_node_00->global[nnodesg];
      }
      local_5e8 = (REF_INT)(local_5e0 / (long)((ref_mpi->n + 6) / ref_mpi->n));
    }
    else {
      if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
        local_5f8 = -1;
      }
      else {
        local_5f8 = ref_node_00->global[nnodesg];
      }
      local_5e8 = (int)((local_5f8 -
                        (7 - ref_mpi->n * (6 / ref_mpi->n)) * ((ref_mpi->n + 6) / ref_mpi->n)) /
                       (long)(6 / ref_mpi->n)) + (7 - ref_mpi->n * (6 / ref_mpi->n));
    }
    ref_node_00->part[nnodesg] = local_5e8;
    uVar2 = ref_node_add(ref_node_00,4,&cell);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x2b7,"ref_fixture_pri_tet_cap_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[cell * 0xf] = 1.0;
    ref_node_00->real[cell * 0xf + 1] = 0.0;
    ref_node_00->real[cell * 0xf + 2] = 1.0;
    if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
      local_628 = -1;
    }
    else {
      local_628 = ref_node_00->global[cell];
    }
    if (local_628 / (long)((ref_mpi->n + 6) / ref_mpi->n) <
        (long)(7 - ref_mpi->n * (6 / ref_mpi->n))) {
      if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
        local_648 = -1;
      }
      else {
        local_648 = ref_node_00->global[cell];
      }
      local_650 = (REF_INT)(local_648 / (long)((ref_mpi->n + 6) / ref_mpi->n));
    }
    else {
      if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
        local_660 = -1;
      }
      else {
        local_660 = ref_node_00->global[cell];
      }
      local_650 = (int)((local_660 -
                        (7 - ref_mpi->n * (6 / ref_mpi->n)) * ((ref_mpi->n + 6) / ref_mpi->n)) /
                       (long)(6 / ref_mpi->n)) + (7 - ref_mpi->n * (6 / ref_mpi->n));
    }
    ref_node_00->part[cell] = local_650;
    uVar2 = ref_node_add(ref_node_00,5,local);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x2b8,"ref_fixture_pri_tet_cap_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[local[0] * 0xf] = 0.0;
    ref_node_00->real[local[0] * 0xf + 1] = 1.0;
    ref_node_00->real[local[0] * 0xf + 2] = 1.0;
    if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0)) {
      local_690 = -1;
    }
    else {
      local_690 = ref_node_00->global[local[0]];
    }
    if (local_690 / (long)((ref_mpi->n + 6) / ref_mpi->n) <
        (long)(7 - ref_mpi->n * (6 / ref_mpi->n))) {
      if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0))
      {
        local_6b0 = -1;
      }
      else {
        local_6b0 = ref_node_00->global[local[0]];
      }
      local_6b8 = (REF_INT)(local_6b0 / (long)((ref_mpi->n + 6) / ref_mpi->n));
    }
    else {
      if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0))
      {
        local_6c8 = -1;
      }
      else {
        local_6c8 = ref_node_00->global[local[0]];
      }
      local_6b8 = (int)((local_6c8 -
                        (7 - ref_mpi->n * (6 / ref_mpi->n)) * ((ref_mpi->n + 6) / ref_mpi->n)) /
                       (long)(6 / ref_mpi->n)) + (7 - ref_mpi->n * (6 / ref_mpi->n));
    }
    ref_node_00->part[local[0]] = local_6b8;
    uVar2 = ref_node_add(ref_node_00,6,local + 1);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x2b9,"ref_fixture_pri_tet_cap_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[local[1] * 0xf] = 0.3;
    ref_node_00->real[local[1] * 0xf + 1] = 0.3;
    ref_node_00->real[local[1] * 0xf + 2] = 2.0;
    if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0)) {
      local_6f8 = -1;
    }
    else {
      local_6f8 = ref_node_00->global[local[1]];
    }
    if (local_6f8 / (long)((ref_mpi->n + 6) / ref_mpi->n) <
        (long)(7 - ref_mpi->n * (6 / ref_mpi->n))) {
      if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0))
      {
        local_718 = -1;
      }
      else {
        local_718 = ref_node_00->global[local[1]];
      }
      local_720 = (REF_INT)(local_718 / (long)((ref_mpi->n + 6) / ref_mpi->n));
    }
    else {
      if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0))
      {
        local_730 = -1;
      }
      else {
        local_730 = ref_node_00->global[local[1]];
      }
      local_720 = (int)((local_730 -
                        (7 - ref_mpi->n * (6 / ref_mpi->n)) * ((ref_mpi->n + 6) / ref_mpi->n)) /
                       (long)(6 / ref_mpi->n)) + (7 - ref_mpi->n * (6 / ref_mpi->n));
    }
    ref_node_00->part[local[1]] = local_720;
    uVar2 = ref_cell_add(pRVar1->cell[8],&nnodesg,&ref_private_macro_code_rss);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",699
             ,"ref_fixture_pri_tet_cap_grid",(ulong)uVar2,"add prism");
      return uVar2;
    }
  }
  else {
    if (4 / ((ref_mpi->n + 6) / ref_mpi->n) < 7 - ref_mpi->n * (6 / ref_mpi->n)) {
      local_544 = 4 / ((ref_mpi->n + 6) / ref_mpi->n);
    }
    else {
      local_544 = (4 - (7 - ref_mpi->n * (6 / ref_mpi->n)) * ((ref_mpi->n + 6) / ref_mpi->n)) /
                  (6 / ref_mpi->n) + (7 - ref_mpi->n * (6 / ref_mpi->n));
    }
    if (ref_mpi->id == local_544) goto LAB_00129775;
    if (5 / ((ref_mpi->n + 6) / ref_mpi->n) < 7 - ref_mpi->n * (6 / ref_mpi->n)) {
      local_570 = 5 / ((ref_mpi->n + 6) / ref_mpi->n);
    }
    else {
      local_570 = (5 - (7 - ref_mpi->n * (6 / ref_mpi->n)) * ((ref_mpi->n + 6) / ref_mpi->n)) /
                  (6 / ref_mpi->n) + (7 - ref_mpi->n * (6 / ref_mpi->n));
    }
    if (ref_mpi->id == local_570) goto LAB_00129775;
    if (6 / ((ref_mpi->n + 6) / ref_mpi->n) < 7 - ref_mpi->n * (6 / ref_mpi->n)) {
      local_59c = 6 / ((ref_mpi->n + 6) / ref_mpi->n);
    }
    else {
      local_59c = (6 - (7 - ref_mpi->n * (6 / ref_mpi->n)) * ((ref_mpi->n + 6) / ref_mpi->n)) /
                  (6 / ref_mpi->n) + (7 - ref_mpi->n * (6 / ref_mpi->n));
    }
    if (ref_mpi->id == local_59c) goto LAB_00129775;
  }
  uVar2 = ref_node_initialize_n_global(ref_node_00,7);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x2be
           ,"ref_fixture_pri_tet_cap_grid",(ulong)uVar2,"init glob");
    return uVar2;
  }
  local[0x1a] = 0;
  if (0 / ((ref_mpi->n + 6) / ref_mpi->n) < 7 - ref_mpi->n * (6 / ref_mpi->n)) {
    local_768 = 0 / ((ref_mpi->n + 6) / ref_mpi->n);
  }
  else {
    local_768 = -((7 - ref_mpi->n * (6 / ref_mpi->n)) * ((ref_mpi->n + 6) / ref_mpi->n)) /
                (6 / ref_mpi->n) + (7 - ref_mpi->n * (6 / ref_mpi->n));
  }
  if (ref_mpi->id == local_768) {
LAB_0012aca6:
    uVar2 = ref_node_local(ref_node_00,0,&nnodesg);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x2cd,"ref_fixture_pri_tet_cap_grid",(ulong)uVar2,"loc");
      return uVar2;
    }
    uVar2 = ref_node_local(ref_node_00,3,&cell);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x2ce,"ref_fixture_pri_tet_cap_grid",(ulong)uVar2,"loc");
      return uVar2;
    }
    uVar2 = ref_node_local(ref_node_00,4,local);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x2cf,"ref_fixture_pri_tet_cap_grid",(ulong)uVar2,"loc");
      return uVar2;
    }
    uVar2 = ref_node_local(ref_node_00,1,local + 1);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x2d0,"ref_fixture_pri_tet_cap_grid",(ulong)uVar2,"loc");
      return uVar2;
    }
    local[2] = 10;
    uVar2 = ref_cell_add(pRVar1->cell[6],&nnodesg,&ref_private_macro_code_rss);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x2d2,"ref_fixture_pri_tet_cap_grid",(ulong)uVar2,"add quad");
      return uVar2;
    }
  }
  else {
    if (3 / ((ref_mpi->n + 6) / ref_mpi->n) < 7 - ref_mpi->n * (6 / ref_mpi->n)) {
      local_794 = 3 / ((ref_mpi->n + 6) / ref_mpi->n);
    }
    else {
      local_794 = (3 - (7 - ref_mpi->n * (6 / ref_mpi->n)) * ((ref_mpi->n + 6) / ref_mpi->n)) /
                  (6 / ref_mpi->n) + (7 - ref_mpi->n * (6 / ref_mpi->n));
    }
    if (ref_mpi->id == local_794) goto LAB_0012aca6;
    if (4 / ((ref_mpi->n + 6) / ref_mpi->n) < 7 - ref_mpi->n * (6 / ref_mpi->n)) {
      local_7c0 = 4 / ((ref_mpi->n + 6) / ref_mpi->n);
    }
    else {
      local_7c0 = (4 - (7 - ref_mpi->n * (6 / ref_mpi->n)) * ((ref_mpi->n + 6) / ref_mpi->n)) /
                  (6 / ref_mpi->n) + (7 - ref_mpi->n * (6 / ref_mpi->n));
    }
    if (ref_mpi->id == local_7c0) goto LAB_0012aca6;
    if (1 / ((ref_mpi->n + 6) / ref_mpi->n) < 7 - ref_mpi->n * (6 / ref_mpi->n)) {
      local_7ec = 1 / ((ref_mpi->n + 6) / ref_mpi->n);
    }
    else {
      local_7ec = (1 - (7 - ref_mpi->n * (6 / ref_mpi->n)) * ((ref_mpi->n + 6) / ref_mpi->n)) /
                  (6 / ref_mpi->n) + (7 - ref_mpi->n * (6 / ref_mpi->n));
    }
    if (ref_mpi->id == local_7ec) goto LAB_0012aca6;
  }
  local[0x1a] = 3;
  if (3 / ((ref_mpi->n + 6) / ref_mpi->n) < 7 - ref_mpi->n * (6 / ref_mpi->n)) {
    local_818 = 3 / ((ref_mpi->n + 6) / ref_mpi->n);
  }
  else {
    local_818 = (3 - (7 - ref_mpi->n * (6 / ref_mpi->n)) * ((ref_mpi->n + 6) / ref_mpi->n)) /
                (6 / ref_mpi->n) + (7 - ref_mpi->n * (6 / ref_mpi->n));
  }
  if (ref_mpi->id != local_818) {
    if (5 / ((ref_mpi->n + 6) / ref_mpi->n) < 7 - ref_mpi->n * (6 / ref_mpi->n)) {
      local_844 = 5 / ((ref_mpi->n + 6) / ref_mpi->n);
    }
    else {
      local_844 = (5 - (7 - ref_mpi->n * (6 / ref_mpi->n)) * ((ref_mpi->n + 6) / ref_mpi->n)) /
                  (6 / ref_mpi->n) + (7 - ref_mpi->n * (6 / ref_mpi->n));
    }
    if (ref_mpi->id != local_844) {
      if (4 / ((ref_mpi->n + 6) / ref_mpi->n) < 7 - ref_mpi->n * (6 / ref_mpi->n)) {
        local_870 = 4 / ((ref_mpi->n + 6) / ref_mpi->n);
      }
      else {
        local_870 = (4 - (7 - ref_mpi->n * (6 / ref_mpi->n)) * ((ref_mpi->n + 6) / ref_mpi->n)) /
                    (6 / ref_mpi->n) + (7 - ref_mpi->n * (6 / ref_mpi->n));
      }
      if (ref_mpi->id != local_870) goto LAB_0012b51f;
    }
  }
  uVar2 = ref_node_local(ref_node_00,3,&nnodesg);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x2df
           ,"ref_fixture_pri_tet_cap_grid",(ulong)uVar2,"loc");
    return uVar2;
  }
  uVar2 = ref_node_local(ref_node_00,5,&cell);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x2e0
           ,"ref_fixture_pri_tet_cap_grid",(ulong)uVar2,"loc");
    return uVar2;
  }
  uVar2 = ref_node_local(ref_node_00,4,local);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x2e1
           ,"ref_fixture_pri_tet_cap_grid",(ulong)uVar2,"loc");
    return uVar2;
  }
  local[1] = 100;
  uVar2 = ref_cell_add(pRVar1->cell[3],&nnodesg,&ref_private_macro_code_rss);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x2e3
           ,"ref_fixture_pri_tet_cap_grid",(ulong)uVar2,"add tri");
    return uVar2;
  }
LAB_0012b51f:
  local[0x1a] = 0;
  if (0 / ((ref_mpi->n + 6) / ref_mpi->n) < 7 - ref_mpi->n * (6 / ref_mpi->n)) {
    local_89c = 0 / ((ref_mpi->n + 6) / ref_mpi->n);
  }
  else {
    local_89c = -((7 - ref_mpi->n * (6 / ref_mpi->n)) * ((ref_mpi->n + 6) / ref_mpi->n)) /
                (6 / ref_mpi->n) + (7 - ref_mpi->n * (6 / ref_mpi->n));
  }
  if (ref_mpi->id != local_89c) {
    if (1 / ((ref_mpi->n + 6) / ref_mpi->n) < 7 - ref_mpi->n * (6 / ref_mpi->n)) {
      local_8c8 = 1 / ((ref_mpi->n + 6) / ref_mpi->n);
    }
    else {
      local_8c8 = (1 - (7 - ref_mpi->n * (6 / ref_mpi->n)) * ((ref_mpi->n + 6) / ref_mpi->n)) /
                  (6 / ref_mpi->n) + (7 - ref_mpi->n * (6 / ref_mpi->n));
    }
    if (ref_mpi->id != local_8c8) {
      if (2 / ((ref_mpi->n + 6) / ref_mpi->n) < 7 - ref_mpi->n * (6 / ref_mpi->n)) {
        local_8f4 = 2 / ((ref_mpi->n + 6) / ref_mpi->n);
      }
      else {
        local_8f4 = (2 - (7 - ref_mpi->n * (6 / ref_mpi->n)) * ((ref_mpi->n + 6) / ref_mpi->n)) /
                    (6 / ref_mpi->n) + (7 - ref_mpi->n * (6 / ref_mpi->n));
      }
      if (ref_mpi->id != local_8f4) {
        return 0;
      }
    }
  }
  uVar2 = ref_node_local(ref_node_00,0,&nnodesg);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x2f0
           ,"ref_fixture_pri_tet_cap_grid",(ulong)uVar2,"loc");
    return uVar2;
  }
  uVar2 = ref_node_local(ref_node_00,1,&cell);
  if (uVar2 == 0) {
    uVar2 = ref_node_local(ref_node_00,2,local);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x2f2,"ref_fixture_pri_tet_cap_grid",(ulong)uVar2,"loc");
      return uVar2;
    }
    local[1] = 0x65;
    uVar2 = ref_cell_add(pRVar1->cell[3],&nnodesg,&ref_private_macro_code_rss);
    if (uVar2 == 0) {
      return 0;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x2f4
           ,"ref_fixture_pri_tet_cap_grid",(ulong)uVar2,"add tri");
    return uVar2;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x2f1,
         "ref_fixture_pri_tet_cap_grid",(ulong)uVar2,"loc");
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_pri_tet_cap_grid(REF_GRID *ref_grid_ptr,
                                                REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global[REF_CELL_MAX_SIZE_PER];
  REF_INT local[REF_CELL_MAX_SIZE_PER];
  REF_INT cell;
  REF_INT nnodesg = 7;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  global[0] = 0;
  global[1] = 1;
  global[2] = 2;
  global[3] = 3;
  global[4] = 4;
  global[5] = 5;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[4]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[5])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, 1.0, 0.0, 0.0);
    add_that_node(2, 0.0, 1.0, 0.0);
    add_that_node(3, 0.0, 0.0, 1.0);
    add_that_node(4, 1.0, 0.0, 1.0);
    add_that_node(5, 0.0, 1.0, 1.0);

    RSS(ref_cell_add(ref_grid_pri(ref_grid), local, &cell), "add prism");
  }

  global[0] = 3;
  global[1] = 4;
  global[2] = 5;
  global[3] = 6;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    add_that_node(0, 0.0, 0.0, 1.0);
    add_that_node(1, 1.0, 0.0, 1.0);
    add_that_node(2, 0.0, 1.0, 1.0);
    add_that_node(3, 0.3, 0.3, 2.0);

    RSS(ref_cell_add(ref_grid_tet(ref_grid), local, &cell), "add prism");
  }

  RSS(ref_node_initialize_n_global(ref_node, nnodesg), "init glob");

  global[0] = 0;
  global[1] = 3;
  global[2] = 4;
  global[3] = 1;
  global[4] = 10;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    RSS(ref_node_local(ref_node, global[0], &(local[0])), "loc");
    RSS(ref_node_local(ref_node, global[1], &(local[1])), "loc");
    RSS(ref_node_local(ref_node, global[2], &(local[2])), "loc");
    RSS(ref_node_local(ref_node, global[3], &(local[3])), "loc");
    local[4] = global[4];
    RSS(ref_cell_add(ref_grid_qua(ref_grid), local, &cell), "add quad");
  }

  global[0] = 3;
  global[1] = 5;
  global[2] = 4;
  global[3] = 100;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2])) {
    RSS(ref_node_local(ref_node, global[0], &(local[0])), "loc");
    RSS(ref_node_local(ref_node, global[1], &(local[1])), "loc");
    RSS(ref_node_local(ref_node, global[2], &(local[2])), "loc");
    local[3] = global[3];
    RSS(ref_cell_add(ref_grid_tri(ref_grid), local, &cell), "add tri");
  }

  global[0] = 0;
  global[1] = 1;
  global[2] = 2;
  global[3] = 101;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2])) {
    RSS(ref_node_local(ref_node, global[0], &(local[0])), "loc");
    RSS(ref_node_local(ref_node, global[1], &(local[1])), "loc");
    RSS(ref_node_local(ref_node, global[2], &(local[2])), "loc");
    local[3] = global[3];
    RSS(ref_cell_add(ref_grid_tri(ref_grid), local, &cell), "add tri");
  }

  return REF_SUCCESS;
}